

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RFC4880.cpp
# Opt level: O2

bool RFC4880::PBEDeriveKey(ByteString *password,ByteString *salt,AESKey **ppKey)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  byte *pbVar5;
  CryptoFactory *pCVar6;
  undefined4 extraout_var;
  AESKey *this;
  bool bVar8;
  char *format;
  int iVar9;
  ByteString intermediate;
  long *plVar7;
  
  sVar4 = ByteString::size(salt);
  if (sVar4 < 8) {
    format = "Insufficient salt data supplied for password-based encryption";
    iVar3 = 0x2e;
  }
  else {
    sVar4 = ByteString::size(password);
    if (ppKey == (AESKey **)0x0) {
      return false;
    }
    if (sVar4 == 0) {
      return false;
    }
    sVar4 = ByteString::size(salt);
    pbVar5 = ByteString::operator[](salt,sVar4 - 1);
    bVar1 = *pbVar5;
    pCVar6 = CryptoFactory::i();
    iVar3 = (*pCVar6->_vptr_CryptoFactory[4])(pCVar6,4);
    plVar7 = (long *)CONCAT44(extraout_var,iVar3);
    if (plVar7 != (long *)0x0) {
      ByteString::ByteString(&intermediate);
      cVar2 = (**(code **)(*plVar7 + 0x10))(plVar7);
      iVar3 = 0x4f;
      if ((((cVar2 != '\0') && (cVar2 = (**(code **)(*plVar7 + 0x18))(plVar7,salt), cVar2 != '\0'))
          && (cVar2 = (**(code **)(*plVar7 + 0x18))(plVar7,password), cVar2 != '\0')) &&
         (cVar2 = (**(code **)(*plVar7 + 0x20))(plVar7,&intermediate), cVar2 != '\0')) {
        iVar9 = bVar1 + 0x5dc;
        iVar3 = 0x5d;
        do {
          iVar9 = iVar9 + -1;
          if (iVar9 == 0) {
            this = (AESKey *)operator_new(0x38);
            AESKey::AESKey(this,0x100);
            *ppKey = this;
            (*(this->super_SymmetricKey).super_Serialisable._vptr_Serialisable[3])
                      (this,&intermediate);
            pCVar6 = CryptoFactory::i();
            bVar8 = true;
            (*pCVar6->_vptr_CryptoFactory[5])(pCVar6,plVar7);
            goto LAB_0015c94a;
          }
          cVar2 = (**(code **)(*plVar7 + 0x10))(plVar7);
        } while (((cVar2 != '\0') &&
                 (cVar2 = (**(code **)(*plVar7 + 0x18))(plVar7,&intermediate), cVar2 != '\0')) &&
                (cVar2 = (**(code **)(*plVar7 + 0x20))(plVar7,&intermediate), cVar2 != '\0'));
      }
      softHSMLog(3,"PBEDeriveKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/data_mgr/RFC4880.cpp"
                 ,iVar3,"Hashing failed");
      pCVar6 = CryptoFactory::i();
      (*pCVar6->_vptr_CryptoFactory[5])(pCVar6,plVar7);
      bVar8 = false;
LAB_0015c94a:
      ByteString::~ByteString(&intermediate);
      return bVar8;
    }
    format = "Could not get a SHA-256 instance";
    iVar3 = 0x41;
  }
  softHSMLog(3,"PBEDeriveKey",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/data_mgr/RFC4880.cpp"
             ,iVar3,format);
  return false;
}

Assistant:

bool RFC4880::PBEDeriveKey(const ByteString& password, ByteString& salt, AESKey** ppKey)
{
	// Check that a proper salt value was supplied; it should be at least 8 bytes long
	if (salt.size() < 8)
	{
		ERROR_MSG("Insufficient salt data supplied for password-based encryption");

		return false;
	}

	// Check other parameters
	if ((password.size() == 0) || (ppKey == NULL))
	{
		return false;
	}

	// Determine the iteration count based on the last byte of the salt
	unsigned int iter = PBE_ITERATION_BASE_COUNT + salt[salt.size() - 1];

	// Get a hash instance
	HashAlgorithm* hash = CryptoFactory::i()->getHashAlgorithm(HashAlgo::SHA256);

	if (hash == NULL)
	{
		ERROR_MSG("Could not get a SHA-256 instance");

		return false;
	}

	// Perform the first iteration which takes as input the salt value and
	// the password
	ByteString intermediate;

	if (!hash->hashInit() ||
	    !hash->hashUpdate(salt) ||
	    !hash->hashUpdate(password) ||
	    !hash->hashFinal(intermediate))
	{
		ERROR_MSG("Hashing failed");

		CryptoFactory::i()->recycleHashAlgorithm(hash);

		return false;
	}

	// Perform the remaining iteration
	while (--iter > 0)
	{
		if (!hash->hashInit() ||
		    !hash->hashUpdate(intermediate) ||
		    !hash->hashFinal(intermediate))
		{
			ERROR_MSG("Hashing failed");

			CryptoFactory::i()->recycleHashAlgorithm(hash);

			return false;
		}
	}

	// Create the AES key instance
	*ppKey = new AESKey(256);
	(*ppKey)->setKeyBits(intermediate);

	// Release the hash instance
	CryptoFactory::i()->recycleHashAlgorithm(hash);

	return true;
}